

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax,
          int startNodeIndex,int endNodeIndex)

{
  uint uVar1;
  uint uVar2;
  btQuantizedBvhNode *aabbMin2;
  int iVar3;
  
  aabbMin2 = (this->m_quantizedContiguousNodes).m_data + startNodeIndex;
  iVar3 = 0;
  do {
    if (endNodeIndex <= startNodeIndex) {
      if (maxIterations < iVar3) {
        maxIterations = iVar3;
      }
      return;
    }
    uVar2 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,aabbMin2->m_quantizedAabbMin,
                       aabbMin2->m_quantizedAabbMax);
    uVar1 = aabbMin2->m_escapeIndexOrTriangleIndex;
    if (uVar2 == 0 || (int)uVar1 < 0) {
      if (uVar2 != 0 || -1 < (int)uVar1) goto LAB_001336c6;
      startNodeIndex = startNodeIndex - uVar1;
      aabbMin2 = aabbMin2 + -uVar1;
    }
    else {
      (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                (nodeCallback,(ulong)(uVar1 >> 0x15),(ulong)(uVar1 & 0x1fffff));
LAB_001336c6:
      aabbMin2 = aabbMin2 + 1;
      startNodeIndex = startNodeIndex + 1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTree(btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax,int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		
		if (isLeafNode && aabbOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}